

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

bool pbrt::anon_unknown_3::initArg(string *str,bool *ptr)

{
  bool bVar1;
  byte bVar2;
  undefined1 *in_RSI;
  char *in_stack_ffffffffffffff78;
  string *__rhs;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  string local_68 [32];
  string *in_stack_ffffffffffffffb8;
  string local_38 [32];
  undefined1 *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  normalizeArg(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_38);
  if (bVar1) {
    *local_18 = 0;
    local_1 = true;
  }
  else {
    __rhs = local_68;
    normalizeArg(in_stack_ffffffffffffffb8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                            (char *)__rhs);
    std::__cxx11::string::~string(local_68);
    if ((bVar2 & 1) == 0) {
      local_1 = false;
    }
    else {
      *local_18 = 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool initArg(const std::string &str, bool *ptr) {
    if (normalizeArg(str) == "false") {
        *ptr = false;
        return true;
    } else if (normalizeArg(str) == "true") {
        *ptr = true;
        return true;
    }
    return false;
}